

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

cbtScalar gjkepa2_impl::GJK::projectorigin
                    (cbtVector3 *a,cbtVector3 *b,cbtVector3 *c,cbtScalar *w,U *m)

{
  uint uVar1;
  cbtVector3 *a_00;
  undefined1 auVar2 [16];
  cbtVector3 *this;
  U i;
  long lVar3;
  float fVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  ulong extraout_XMM0_Qb;
  undefined1 in_ZMM0 [64];
  undefined1 auVar18 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar30 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  cbtVector3 cVar31;
  U subm;
  cbtScalar subw [2];
  cbtVector3 n;
  cbtVector3 *vt [3];
  cbtVector3 local_98;
  cbtVector3 local_88;
  cbtVector3 dl [3];
  cbtVector3 p;
  undefined1 extraout_var [60];
  
  auVar30 = in_ZMM1._8_56_;
  auVar18 = in_ZMM0._8_56_;
  vt[0] = a;
  vt[1] = b;
  vt[2] = c;
  cVar31 = ::operator-(a,b);
  auVar20._0_8_ = cVar31.m_floats._8_8_;
  auVar20._8_56_ = auVar30;
  auVar24._0_8_ = cVar31.m_floats._0_8_;
  auVar24._8_56_ = auVar18;
  dl[0].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24._0_16_,auVar20._0_16_);
  auVar18 = ZEXT856(dl[0].m_floats._8_8_);
  cVar31 = ::operator-(b,c);
  auVar21._0_8_ = cVar31.m_floats._8_8_;
  auVar21._8_56_ = auVar30;
  auVar8._0_8_ = cVar31.m_floats._0_8_;
  auVar8._8_56_ = auVar18;
  dl[1].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar21._0_16_);
  auVar18 = ZEXT856(dl[1].m_floats._8_8_);
  cVar31 = ::operator-(c,a);
  auVar22._0_8_ = cVar31.m_floats._8_8_;
  auVar22._8_56_ = auVar30;
  auVar9._0_8_ = cVar31.m_floats._0_8_;
  auVar9._8_56_ = auVar18;
  dl[2].m_floats = (cbtScalar  [4])vmovlhps_avx(auVar9._0_16_,auVar22._0_16_);
  auVar18 = ZEXT856(dl[2].m_floats._8_8_);
  this = dl;
  cVar31 = cbtVector3::cross(this,dl + 1);
  auVar23._0_8_ = cVar31.m_floats._8_8_;
  auVar23._8_56_ = auVar30;
  auVar10._0_8_ = cVar31.m_floats._0_8_;
  auVar10._8_56_ = auVar18;
  n.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar23._0_16_);
  auVar11._0_4_ = cbtVector3::length2(&n);
  auVar11._4_60_ = extraout_var;
  if (auVar11._0_4_ <= 0.0) {
    cVar6 = -1.0;
  }
  else {
    auVar24 = ZEXT464(0xbf800000);
    lVar3 = 0;
    subw[0] = 0.0;
    subw[1] = 0.0;
    subm = 0;
    auVar13 = auVar11;
    while( true ) {
      cVar6 = auVar24._0_4_;
      auVar30 = auVar24._8_56_;
      auVar18 = auVar13._8_56_;
      if (lVar3 == 3) break;
      a_00 = vt[lVar3];
      cVar31 = cbtVector3::cross(this,&n);
      auVar25._0_8_ = cVar31.m_floats._8_8_;
      auVar25._8_56_ = auVar30;
      auVar12._0_8_ = cVar31.m_floats._0_8_;
      auVar12._8_56_ = auVar18;
      auVar19 = vmovshdup_avx(auVar12._0_16_);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * a_00->m_floats[1])),auVar12._0_16_,
                                ZEXT416((uint)a_00->m_floats[0]));
      auVar13 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar19 = vfmadd132ss_fma(auVar25._0_16_,auVar19,ZEXT416((uint)a_00->m_floats[2]));
      if (auVar19._0_4_ <= 0.0) {
        auVar24 = ZEXT464((uint)cVar6);
      }
      else {
        uVar1 = projectorigin::imd3[lVar3];
        auVar13._0_4_ = projectorigin(a_00,vt[uVar1],subw,&subm);
        auVar13._4_60_ = extraout_var_00;
        auVar24 = ZEXT464((uint)cVar6);
        if ((cVar6 < 0.0) || (auVar13._0_4_ < cVar6)) {
          *m = (1 << (uVar1 & 0x1f) & (int)(subm << 0x1e) >> 0x1f) +
               (1 << ((uint)lVar3 & 0x1f) & -(subm & 1));
          w[lVar3] = subw[0];
          w[uVar1] = subw[1];
          auVar24 = ZEXT1664(auVar13._0_16_);
          w[projectorigin::imd3[uVar1]] = 0.0;
        }
      }
      lVar3 = lVar3 + 1;
      this = this + 1;
    }
    if (cVar6 < 0.0) {
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(a->m_floats[1] * n.m_floats[1])),
                                ZEXT416((uint)a->m_floats[0]),ZEXT416((uint)n.m_floats[0]));
      auVar19 = vfmadd132ss_fma(ZEXT416((uint)a->m_floats[2]),auVar19,ZEXT416((uint)n.m_floats[2]));
      if (auVar11._0_4_ < 0.0) {
        fVar4 = sqrtf(auVar11._0_4_);
      }
      else {
        auVar2 = vsqrtss_avx(ZEXT416((uint)auVar11._0_4_),ZEXT416((uint)auVar11._0_4_));
        fVar4 = auVar2._0_4_;
      }
      fVar5 = auVar19._0_4_ / auVar11._0_4_;
      auVar19._0_4_ = fVar5 * n.m_floats[0];
      auVar19._4_4_ = fVar5 * n.m_floats[1];
      auVar19._8_4_ = fVar5 * 0.0;
      auVar19._12_4_ = fVar5 * 0.0;
      auVar30 = ZEXT856(auVar19._8_8_);
      p.m_floats = (cbtScalar  [4])
                   vinsertps_avx(auVar19,ZEXT416((uint)(fVar5 * n.m_floats[2])),0x28);
      cVar6 = cbtVector3::length2(&p);
      *m = 7;
      auVar18 = extraout_var_01;
      cVar31 = ::operator-(b,&p);
      auVar26._0_8_ = cVar31.m_floats._8_8_;
      auVar26._8_56_ = auVar30;
      auVar14._0_8_ = cVar31.m_floats._0_8_;
      auVar14._8_56_ = auVar18;
      local_98.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar14._0_16_,auVar26._0_16_);
      auVar18 = ZEXT856(local_98.m_floats._8_8_);
      cVar31 = cbtVector3::cross(dl + 1,&local_98);
      auVar27._0_8_ = cVar31.m_floats._8_8_;
      auVar27._8_56_ = auVar30;
      auVar15._0_8_ = cVar31.m_floats._0_8_;
      auVar15._8_56_ = auVar18;
      local_88.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar15._0_16_,auVar27._0_16_);
      cVar7 = cbtVector3::length(&local_88);
      auVar18 = ZEXT856(extraout_XMM0_Qb);
      *w = cVar7 / fVar4;
      cVar31 = ::operator-(c,&p);
      auVar28._0_8_ = cVar31.m_floats._8_8_;
      auVar28._8_56_ = auVar30;
      auVar16._0_8_ = cVar31.m_floats._0_8_;
      auVar16._8_56_ = auVar18;
      local_98.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar16._0_16_,auVar28._0_16_);
      auVar18 = ZEXT856(local_98.m_floats._8_8_);
      cVar31 = cbtVector3::cross(dl + 2,&local_98);
      auVar29._0_8_ = cVar31.m_floats._8_8_;
      auVar29._8_56_ = auVar30;
      auVar17._0_8_ = cVar31.m_floats._0_8_;
      auVar17._8_56_ = auVar18;
      local_88.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17._0_16_,auVar29._0_16_);
      cVar7 = cbtVector3::length(&local_88);
      w[1] = cVar7 / fVar4;
      w[2] = 1.0 - (cVar7 / fVar4 + *w);
    }
  }
  return cVar6;
}

Assistant:

static cbtScalar projectorigin(const cbtVector3& a,
								  const cbtVector3& b,
								  const cbtVector3& c,
								  cbtScalar* w, U& m)
	{
		static const U imd3[] = {1, 2, 0};
		const cbtVector3* vt[] = {&a, &b, &c};
		const cbtVector3 dl[] = {a - b, b - c, c - a};
		const cbtVector3 n = cbtCross(dl[0], dl[1]);
		const cbtScalar l = n.length2();
		if (l > GJK_SIMPLEX3_EPS)
		{
			cbtScalar mindist = -1;
			cbtScalar subw[2] = {0.f, 0.f};
			U subm(0);
			for (U i = 0; i < 3; ++i)
			{
				if (cbtDot(*vt[i], cbtCross(dl[i], n)) > 0)
				{
					const U j = imd3[i];
					const cbtScalar subd(projectorigin(*vt[i], *vt[j], subw, subm));
					if ((mindist < 0) || (subd < mindist))
					{
						mindist = subd;
						m = static_cast<U>(((subm & 1) ? 1 << i : 0) + ((subm & 2) ? 1 << j : 0));
						w[i] = subw[0];
						w[j] = subw[1];
						w[imd3[j]] = 0;
					}
				}
			}
			if (mindist < 0)
			{
				const cbtScalar d = cbtDot(a, n);
				const cbtScalar s = cbtSqrt(l);
				const cbtVector3 p = n * (d / l);
				mindist = p.length2();
				m = 7;
				w[0] = (cbtCross(dl[1], b - p)).length() / s;
				w[1] = (cbtCross(dl[2], c - p)).length() / s;
				w[2] = 1 - (w[0] + w[1]);
			}
			return (mindist);
		}
		return (-1);
	}